

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestTexture::setDecode
          (SRGBTestTexture *this,SRGBDecode decoding)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  char *msg;
  long lVar2;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0xb8))
            (-(uint)(this->m_targetType != TEXTURETYPE_2D) | 0xde1,(this->m_source).m_glTexture);
  if (decoding == SRGBDECODE_DECODE) {
    (**(code **)(lVar2 + 0x1360))
              (-(uint)(this->m_targetType != TEXTURETYPE_2D) | 0xde1,0x8a48,0x8a49);
    err = (**(code **)(lVar2 + 0x800))();
    msg = "glTexParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_DECODE_EXT)";
    iVar1 = 0x208;
  }
  else {
    if (decoding != SRGBDECODE_SKIP_DECODE) goto LAB_00458a8f;
    (**(code **)(lVar2 + 0x1360))
              (-(uint)(this->m_targetType != TEXTURETYPE_2D) | 0xde1,0x8a48,0x8a4a);
    err = (**(code **)(lVar2 + 0x800))();
    msg = "glTexParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_SKIP_DECODE_EXT)"
    ;
    iVar1 = 0x202;
  }
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                  ,iVar1);
LAB_00458a8f:
  (**(code **)(lVar2 + 0xb8))(-(uint)(this->m_targetType != TEXTURETYPE_2D) | 0xde1,0);
  this->m_decoding = decoding;
  return;
}

Assistant:

void SRGBTestTexture::setDecode (const SRGBDecode decoding)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindTexture(this->getGLTargetType(), this->getHandle());

	switch (decoding)
	{
		case SRGBDECODE_SKIP_DECODE:
		{
			gl.texParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_SKIP_DECODE_EXT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_SKIP_DECODE_EXT)");
			break;
		}
		case SRGBDECODE_DECODE:
		{
			gl.texParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_DECODE_EXT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri(this->getGLTargetType(), GL_TEXTURE_SRGB_DECODE_EXT, GL_DECODE_EXT)");
			break;
		}
		case SRGBDECODE_DECODE_DEFAULT:
		{
			// do not use srgb decode options. Set to default
			break;
		}
		default:
			DE_FATAL("Error: Decoding option not recognised");
	}

	gl.bindTexture(this->getGLTargetType(), 0);

	m_decoding = decoding;
}